

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
* __thiscall
google::protobuf::compiler::cpp::FileGenerator::MessagesInTopologicalOrder
          (vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           *__return_storage_ptr__,FileGenerator *this)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference this_00;
  pointer this_01;
  Descriptor *local_40;
  ulong local_38;
  size_t i;
  undefined1 local_19;
  FileGenerator *local_18;
  FileGenerator *this_local;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *descs;
  
  local_19 = 0;
  local_18 = this;
  this_local = (FileGenerator *)__return_storage_ptr__;
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::vector(__return_storage_ptr__);
  sVar2 = std::
          vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
          ::size(&this->message_generators_);
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::reserve(__return_storage_ptr__,sVar2);
  for (local_38 = 0; uVar1 = local_38,
      sVar2 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ::size(&this->message_generators_), uVar1 < sVar2; local_38 = local_38 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->message_generators_topologically_ordered_,local_38);
    this_00 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ::operator[](&this->message_generators_,(long)*pvVar3);
    this_01 = std::
              unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
              ::operator->(this_00);
    local_40 = MessageGenerator::descriptor(this_01);
    std::
    vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::push_back(__return_storage_ptr__,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Descriptor*> FileGenerator::MessagesInTopologicalOrder()
    const {
  std::vector<const Descriptor*> descs;
  descs.reserve(message_generators_.size());
  for (size_t i = 0; i < message_generators_.size(); ++i) {
    descs.push_back(
        message_generators_[message_generators_topologically_ordered_[i]]
            ->descriptor());
  }
  return descs;
}